

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

bam_plp_t bam_plp_init(bam_plp_auto_f func,void *data)

{
  bam_plp_t p_Var1;
  mempool_t *pmVar2;
  lbnode_t *plVar3;
  bam1_t *pbVar4;
  bam_plp_t iter;
  void *data_local;
  bam_plp_auto_f func_local;
  
  p_Var1 = (bam_plp_t)calloc(1,0x70);
  pmVar2 = mp_init();
  p_Var1->mp = pmVar2;
  plVar3 = mp_alloc(p_Var1->mp);
  p_Var1->tail = plVar3;
  p_Var1->head = plVar3;
  plVar3 = mp_alloc(p_Var1->mp);
  p_Var1->dummy = plVar3;
  p_Var1->max_pos = -1;
  p_Var1->max_tid = -1;
  p_Var1->maxcnt = 8000;
  if (func != (bam_plp_auto_f)0x0) {
    p_Var1->func = func;
    p_Var1->data = data;
    pbVar4 = bam_init1();
    p_Var1->b = pbVar4;
  }
  return p_Var1;
}

Assistant:

bam_plp_t bam_plp_init(bam_plp_auto_f func, void *data)
{
    bam_plp_t iter;
    iter = (bam_plp_t)calloc(1, sizeof(struct __bam_plp_t));
    iter->mp = mp_init();
    iter->head = iter->tail = mp_alloc(iter->mp);
    iter->dummy = mp_alloc(iter->mp);
    iter->max_tid = iter->max_pos = -1;
    iter->maxcnt = 8000;
    if (func) {
        iter->func = func;
        iter->data = data;
        iter->b = bam_init1();
    }
    return iter;
}